

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O3

void __thiscall lunasvg::Canvas::setColor(Canvas *this,Color *color)

{
  uint uVar1;
  
  uVar1 = color->m_value;
  plutovg_canvas_set_rgba
            (this->m_canvas,(float)(uVar1 >> 0x10 & 0xff) / 255.0,(float)(uVar1 >> 8 & 0xff) / 255.0
             ,(float)(uVar1 & 0xff) / 255.0,(float)(uVar1 >> 0x18) / 255.0);
  return;
}

Assistant:

constexpr uint8_t alpha() const { return (m_value >> 24) & 0xff; }